

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

bool kratos::check_parent_param(Param *param,Generator *parent,bool check_param)

{
  int iVar1;
  undefined4 extraout_var;
  UserException *this;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  bool bVar2;
  basic_string_view<char> bVar3;
  string_view format_str;
  format_args args;
  string local_48;
  undefined8 local_28 [2];
  
  if (param == (Param *)0x0) {
    if (!check_param) {
      return false;
    }
  }
  else {
    iVar1 = (*(param->super_Const).super_Var.super_IRNode._vptr_IRNode[0xd])();
    bVar2 = (Generator *)CONCAT44(extraout_var,iVar1) == parent;
    if (!check_param || bVar2) {
      return bVar2;
    }
  }
  this = (UserException *)__cxa_allocate_exception(0x10);
  local_28[0] = 0;
  bVar3 = fmt::v7::to_string_view<char,_0>
                    (
                    "Unable to copy var definition since the width parametrization is not set in parent"
                    );
  format_str.data_ = bVar3.size_;
  format_str.size_ = 0;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_28;
  fmt::v7::detail::vformat_abi_cxx11_(&local_48,(detail *)bVar3.data_,format_str,args);
  UserException::UserException(this,&local_48);
  __cxa_throw(this,&UserException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool check_parent_param(const Param *param, const Generator *parent, bool check_param) {
    bool correct = true;
    if (!param || param->generator() != parent) correct = false;

    if (!correct && check_param)
        throw UserException(
            ::format("Unable to copy var definition since the width parametrization is not set "
                     "in parent"));
    return correct;
}